

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr162.cpp
# Opt level: O1

double IKacos(double f)

{
  ostream *poVar1;
  runtime_error *this;
  double dVar2;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (1.0000001 <= ABS(f)) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"ikfast exception: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/src/kukakr162/ikfast61_kukakr162.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,":",1);
    poVar1 = (ostream *)std::ostream::operator<<(local_190,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"IKacos",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": Assertion \'",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH",0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' failed",8);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,local_1c0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (f <= -1.0) {
    dVar2 = 3.14159265358979;
  }
  else {
    dVar2 = 0.0;
    if (f < 1.0) {
      dVar2 = acos(f);
      return dVar2;
    }
  }
  return dVar2;
}

Assistant:

inline double IKacos(double f)
{
IKFAST_ASSERT( f > -1-IKFAST_SINCOS_THRESH && f < 1+IKFAST_SINCOS_THRESH ); // any more error implies something is wrong with the solver
if( f <= -1 ) return IKPI;
else if( f >= 1 ) return 0;
return acos(f);
}